

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_114>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_114> *this)

{
  code *pcVar1;
  long *plVar2;
  C_A_T_C_H_T_E_S_T_114 obj;
  TApp local_390;
  
  TApp::TApp(&local_390);
  local_390._vptr_TApp = (_func_int **)&PTR__TApp_001f0a98;
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&local_390._vptr_TApp + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  local_390._vptr_TApp = (_func_int **)&PTR__TApp_001f0e60;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_390.args);
  CLI::App::~App(&local_390.app);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }